

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactive.cpp
# Opt level: O1

int printS(Sudoku *s,int u,int v)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  int x;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  
  uVar3 = 0;
  do {
    pcVar5 = "+--+--+--|--+--+--|--+--+--+";
    if (uVar3 == 3) {
      pcVar5 = "---------+--------+---------";
    }
    if (uVar3 == 6) {
      pcVar5 = "---------+--------+---------";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    uVar6 = uVar3 ^ (uint)v;
    uVar4 = 0;
    do {
      if (((uint)*(sudoku_policko *)((long)s + uVar4 * 4) & 0xf) == 0) {
        lVar2 = 3;
        if ((uint)u == uVar4 && uVar6 == 0) {
          pcVar5 = "|O<";
        }
        else {
          pcVar5 = "|. ";
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        if (((uint)*(sudoku_policko *)((long)s + uVar4 * 4) & 0x10) == 0) {
          lVar2 = 1;
          pcVar5 = " ";
        }
        else {
          lVar2 = 1;
          if ((uint)u == uVar4 && uVar6 == 0) {
            pcVar5 = "X";
          }
          else {
            pcVar5 = ".";
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar2);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
    if (uVar3 == (uint)v) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"<--",3);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    uVar3 = uVar3 + 1;
    s = (Sudoku *)((long)s + 0x24);
  } while (uVar3 != 9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"+--+--+--|--+--+--|--+--+--+",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  if (0 < u) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
      iVar7 = iVar7 + 3;
    } while (iVar7 < u * 3);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"^");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"w,s,a,d = pohyb v mrizce",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"1-9     = zapsani cisla",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"x,0     = smazani cisla",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"exit    = ukonceni programu",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "solve   = vyreseni sudoku z aktualniho stavu - pri spatnem vyplneni nefunguje",0x4d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rsolve  = vyreseni sudoku z vychoziho stavu",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"print   = vypise aktualni stav",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  iVar7 = std::ostream::flush();
  return iVar7;
}

Assistant:

int printS ( Sudoku * s, int u, int v )
{
  for(int y=0;y<9;y++) // projdeme radky
  {
    // formatovani car podle toho, ktery radek se zpracovava
    if(y == 3 || y == 6)
    {
      cout << "---------+--------+---------" << endl;
    }
    else
    {
      cout << "+--+--+--|--+--+--|--+--+--+" << endl;
    }
    for(int x=0;x<9;x++)// projdeme bunky v radku
    {
      if (s->s.pole[y*9+x].zapsane) // je tam neco?
      {
        cout << "|";
        cout<< s->s.pole[y*9+x].zapsane; // vypiseme
        if(s->s.pole[y*9+x].pevne) // pridame za to x, pkud je to pevna hodnota
        {
          if(u == x && v == y)
            cout << "X";
          else cout << ".";
        }
        else cout << " ";
      }
      else
      {
        if(u == x && v == y)
          cout<< "|O<";
        else
          cout<< "|. ";
      }
    } 
    cout << "|";
    if(v == y) cout << "<--"; // kresleni ukazatele polohy
    cout << endl;
  }
  cout << "+--+--+--|--+--+--|--+--+--+" << endl;
  cout << " ";
  // kresleni ukazatele polohy
  for (int i = 0;i< u*3; i+=3)
  {
    cout << "   ";
  }
  cout << "^" << endl;
}